

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  SQObjectType SVar5;
  uint uVar6;
  SQTable *pSVar7;
  SQObjectPtr *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  SQOuterVar *pSVar11;
  SQOuterVar *pSVar12;
  SQLocalVarInfo *pSVar13;
  SQLocalVarInfo *pSVar14;
  undefined8 uVar15;
  SQInteger *pSVar16;
  SQFloat SVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  SQObjectFlags SVar21;
  undefined3 uVar22;
  SQFunctionProto *pSVar23;
  SQObjectValue SVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  SQObjectPtr refidx;
  SQObjectPtr val;
  SQObjectPtr key;
  
  pSVar23 = SQFunctionProto::Create
                      (this->_ss,this->lang_features,(ulong)(this->_instructions)._size,
                       this->_nliterals,(ulong)(this->_parameters)._size,
                       (ulong)(this->_functions)._size,(ulong)(this->_outervalues)._size,
                       (ulong)(this->_lineinfos)._size,(ulong)(this->_localvarinfos)._size,
                       (ulong)(this->_defaultparams)._size);
  refidx.super_SQObject._unVal.pTable = (SQTable *)0x0;
  refidx.super_SQObject._type = OT_NULL;
  refidx.super_SQObject._flags = '\0';
  refidx.super_SQObject._5_3_ = 0;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._flags = '\0';
  key.super_SQObject._5_3_ = 0;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._flags = '\0';
  val.super_SQObject._5_3_ = 0;
  pSVar23->_stacksize = this->_stacksize;
  SVar5 = (pSVar23->_sourcename).super_SQObject._type;
  pSVar7 = (pSVar23->_sourcename).super_SQObject._unVal.pTable;
  SVar21 = (this->_sourcename).super_SQObject._flags;
  uVar22 = *(undefined3 *)&(this->_sourcename).super_SQObject.field_0x5;
  SVar17 = (this->_sourcename).super_SQObject._unVal.fFloat;
  uVar18 = *(undefined4 *)((long)&(this->_sourcename).super_SQObject._unVal + 4);
  (pSVar23->_sourcename).super_SQObject._type = (this->_sourcename).super_SQObject._type;
  (pSVar23->_sourcename).super_SQObject._flags = SVar21;
  *(undefined3 *)&(pSVar23->_sourcename).super_SQObject.field_0x5 = uVar22;
  (pSVar23->_sourcename).super_SQObject._unVal.fFloat = SVar17;
  *(undefined4 *)((long)&(pSVar23->_sourcename).super_SQObject._unVal + 4) = uVar18;
  if (((pSVar23->_sourcename).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((pSVar23->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar23->_bgenerator = this->_bgenerator;
  SVar5 = (pSVar23->_name).super_SQObject._type;
  pSVar7 = (pSVar23->_name).super_SQObject._unVal.pTable;
  SVar21 = (this->_name).super_SQObject._flags;
  uVar22 = *(undefined3 *)&(this->_name).super_SQObject.field_0x5;
  SVar17 = (this->_name).super_SQObject._unVal.fFloat;
  uVar18 = *(undefined4 *)((long)&(this->_name).super_SQObject._unVal + 4);
  (pSVar23->_name).super_SQObject._type = (this->_name).super_SQObject._type;
  (pSVar23->_name).super_SQObject._flags = SVar21;
  *(undefined3 *)&(pSVar23->_name).super_SQObject.field_0x5 = uVar22;
  (pSVar23->_name).super_SQObject._unVal.fFloat = SVar17;
  *(undefined4 *)((long)&(pSVar23->_name).super_SQObject._unVal + 4) = uVar18;
  if (((pSVar23->_name).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((pSVar23->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar23->_hoistingLevel = this->_hoistLevel;
  while( true ) {
    SVar24.nInteger =
         SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,&refidx,&key,&val);
    uVar15 = key.super_SQObject._0_8_;
    if (SVar24.pTable == (SQTable *)0xffffffffffffffff) break;
    pSVar8 = pSVar23->_literals;
    SVar5 = pSVar8[val.super_SQObject._unVal.nInteger].super_SQObject._type;
    pSVar7 = pSVar8[val.super_SQObject._unVal.nInteger].super_SQObject._unVal.pTable;
    pSVar9 = pSVar8 + val.super_SQObject._unVal.nInteger;
    (pSVar9->super_SQObject)._type = key.super_SQObject._type;
    (pSVar9->super_SQObject)._flags = key.super_SQObject._flags;
    *(undefined3 *)&(pSVar9->super_SQObject).field_0x5 = key.super_SQObject._5_3_;
    (pSVar9->super_SQObject)._unVal.fFloat = key.super_SQObject._unVal.fFloat;
    *(undefined4 *)((long)&(pSVar9->super_SQObject)._unVal + 4) =
         key.super_SQObject._unVal.nInteger._4_4_;
    if ((pSVar8[val.super_SQObject._unVal.nInteger].super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((pSVar8[val.super_SQObject._unVal.nInteger].super_SQObject._unVal.pTable)->
                super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    key.super_SQObject._0_8_ = uVar15;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    if ((refidx.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    refidx.super_SQObject._type = OT_INTEGER;
    refidx.super_SQObject._flags = '\0';
    refidx.super_SQObject._unVal.nInteger = SVar24.nInteger;
  }
  if ((this->_functions)._size != 0) {
    lVar27 = 0;
    uVar26 = 0;
    do {
      pSVar9 = pSVar23->_functions;
      uVar6 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar27);
      plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar27);
      puVar3 = (undefined4 *)((long)&(((this->_functions)._vals)->super_SQObject)._type + lVar27);
      uVar18 = puVar3[1];
      uVar19 = puVar3[2];
      uVar20 = puVar3[3];
      puVar4 = (undefined4 *)((long)&(pSVar9->super_SQObject)._type + lVar27);
      *puVar4 = *puVar3;
      puVar4[1] = uVar18;
      puVar4[2] = uVar19;
      puVar4[3] = uVar20;
      if ((*(byte *)((long)&(pSVar9->super_SQObject)._type + lVar27 + 3) & 8) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar9->super_SQObject)._unVal + lVar27) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      uVar26 = uVar26 + 1;
      lVar27 = lVar27 + 0x10;
    } while (uVar26 < (this->_functions)._size);
  }
  if ((this->_parameters)._size != 0) {
    lVar27 = 0;
    uVar26 = 0;
    do {
      pSVar9 = pSVar23->_parameters;
      uVar6 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar27);
      plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar27);
      puVar3 = (undefined4 *)((long)&(((this->_parameters)._vals)->super_SQObject)._type + lVar27);
      uVar18 = puVar3[1];
      uVar19 = puVar3[2];
      uVar20 = puVar3[3];
      puVar4 = (undefined4 *)((long)&(pSVar9->super_SQObject)._type + lVar27);
      *puVar4 = *puVar3;
      puVar4[1] = uVar18;
      puVar4[2] = uVar19;
      puVar4[3] = uVar20;
      if ((*(byte *)((long)&(pSVar9->super_SQObject)._type + lVar27 + 3) & 8) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar9->super_SQObject)._unVal + lVar27) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      uVar26 = uVar26 + 1;
      lVar27 = lVar27 + 0x10;
    } while (uVar26 < (this->_parameters)._size);
  }
  if ((this->_outervalues)._size != 0) {
    lVar27 = 0x28;
    uVar26 = 0;
    do {
      pSVar11 = (this->_outervalues)._vals;
      pSVar12 = pSVar23->_outervalues;
      *(undefined4 *)((long)pSVar12 + lVar27 + -0x28) =
           *(undefined4 *)((long)pSVar11 + lVar27 + -0x28);
      uVar6 = *(uint *)((long)pSVar12 + lVar27 + -0x20);
      plVar10 = *(long **)((long)pSVar12 + lVar27 + -0x18);
      puVar3 = (undefined4 *)((long)pSVar11 + lVar27 + -0x20);
      uVar18 = puVar3[1];
      uVar19 = puVar3[2];
      uVar20 = puVar3[3];
      puVar4 = (undefined4 *)((long)pSVar12 + lVar27 + -0x20);
      *puVar4 = *puVar3;
      puVar4[1] = uVar18;
      puVar4[2] = uVar19;
      puVar4[3] = uVar20;
      if ((*(byte *)((long)pSVar12 + lVar27 + -0x1d) & 8) != 0) {
        plVar2 = (long *)(*(long *)((long)pSVar12 + lVar27 + -0x18) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      uVar6 = *(uint *)((long)pSVar12 + lVar27 + -0x10);
      plVar10 = *(long **)((long)pSVar12 + lVar27 + -8);
      puVar3 = (undefined4 *)((long)pSVar11 + lVar27 + -0x10);
      uVar18 = puVar3[1];
      uVar19 = puVar3[2];
      uVar20 = puVar3[3];
      puVar4 = (undefined4 *)((long)pSVar12 + lVar27 + -0x10);
      *puVar4 = *puVar3;
      puVar4[1] = uVar18;
      puVar4[2] = uVar19;
      puVar4[3] = uVar20;
      if ((*(byte *)((long)pSVar12 + lVar27 + -0xd) & 8) != 0) {
        plVar2 = (long *)(*(long *)((long)pSVar12 + lVar27 + -8) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      *(undefined1 *)((long)&pSVar12->_type + lVar27) =
           *(undefined1 *)((long)&pSVar11->_type + lVar27);
      uVar26 = uVar26 + 1;
      lVar27 = lVar27 + 0x30;
    } while (uVar26 < (this->_outervalues)._size);
  }
  if ((this->_localvarinfos)._size != 0) {
    lVar27 = 0;
    uVar26 = 0;
    do {
      pSVar13 = (this->_localvarinfos)._vals;
      pSVar14 = pSVar23->_localvarinfos;
      uVar6 = *(uint *)((long)&(pSVar14->_name).super_SQObject._type + lVar27);
      plVar10 = *(long **)((long)&(pSVar14->_name).super_SQObject._unVal + lVar27);
      puVar3 = (undefined4 *)((long)&(pSVar13->_name).super_SQObject._type + lVar27);
      uVar18 = puVar3[1];
      uVar19 = puVar3[2];
      uVar20 = puVar3[3];
      puVar4 = (undefined4 *)((long)&(pSVar14->_name).super_SQObject._type + lVar27);
      *puVar4 = *puVar3;
      puVar4[1] = uVar18;
      puVar4[2] = uVar19;
      puVar4[3] = uVar20;
      if ((*(byte *)((long)&(pSVar14->_name).super_SQObject._type + lVar27 + 3) & 8) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar14->_name).super_SQObject._unVal + lVar27) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      uVar15 = *(undefined8 *)((long)&pSVar13->_start_op + lVar27);
      *(undefined8 *)((long)&pSVar14->_end_op + lVar27 + 1) =
           *(undefined8 *)((long)&pSVar13->_end_op + lVar27 + 1);
      *(undefined8 *)((long)&pSVar14->_start_op + lVar27) = uVar15;
      uVar26 = uVar26 + 1;
      lVar27 = lVar27 + 0x20;
    } while (uVar26 < (this->_localvarinfos)._size);
  }
  if ((this->_lineinfos)._size != 0) {
    uVar26 = 0;
    do {
      pSVar23->_lineinfos[uVar26] = (this->_lineinfos)._vals[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar26 < (this->_lineinfos)._size);
  }
  uVar26 = (ulong)(this->_defaultparams)._size;
  if (uVar26 != 0) {
    plVar10 = (this->_defaultparams)._vals;
    pSVar16 = pSVar23->_defaultparams;
    uVar25 = 0;
    do {
      pSVar16[uVar25] = plVar10[uVar25];
      uVar25 = uVar25 + 1;
    } while (uVar26 != uVar25);
  }
  memcpy(pSVar23->_instructions,(this->_instructions)._vals,(ulong)(this->_instructions)._size << 3)
  ;
  pSVar23->_varparams = (ulong)this->_varparams;
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&refidx);
  return pSVar23;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{
    SQFunctionProto *f=SQFunctionProto::Create(_ss,lang_features,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;
    f->_hoistingLevel = _hoistLevel;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}